

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmilankoviccalendar.cpp
# Opt level: O3

YearMonthDay __thiscall QMilankovicCalendar::julianDayToDate(QMilankovicCalendar *this,qint64 jd)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  R_conflict20 RVar6;
  YearMonthDay YVar7;
  
  uVar3 = jd * 9 - 0xec5c1e;
  if ((long)uVar3 < 0) {
    uVar5 = jd * -9 + 0xec5c1d;
    uVar3 = uVar5 / 0x5040e;
    uVar4 = ~(uint)uVar3;
    uVar3 = (uVar3 * 0x5040e - uVar5) + 0x5040d;
  }
  else {
    uVar4 = (uint)(uVar3 / 0x5040e);
    uVar3 = uVar3 % 0x5040e;
  }
  uVar1 = (int)((uVar3 & 0xffffffff) / 9) * 100 + 99;
  RVar6 = QRomanCalendrical::dayInYearToYmd((uVar1 % 0x8ead) / 100);
  YVar7.day = RVar6.day;
  iVar2 = uVar4 * 100 + uVar1 / 0x8ead + RVar6.year;
  YVar7._0_8_ = RVar6._0_8_ & 0xffffffff00000000 | (ulong)(iVar2 - (uint)(iVar2 < 1));
  return YVar7;
}

Assistant:

QCalendar::YearMonthDay  QMilankovicCalendar::julianDayToDate(qint64 jd) const
{
    const auto century9Day = qDivMod<NineCenturies>(9 * (jd - MilankovicBaseJd) - 7);
    // Its remainder changes by 9 per day, except roughly once per century.
    const auto year100Day = qDivMod<LeapCentury>(100 * qDiv<9>(century9Day.remainder) + 99);
    // Its remainder changes by 100 per day, except roughly once per year.
    const auto ymd = dayInYearToYmd(qDiv<100>(year100Day.remainder));
    const int y = 100 * century9Day.quotient + year100Day.quotient + ymd.year;
    return QCalendar::YearMonthDay(y > 0 ? y : y - 1, ymd.month, ymd.day);
}